

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sn76489.c
# Opt level: O0

void SN76489_Reset(SN76489_Context *chip)

{
  int local_14;
  int i;
  SN76489_Context *chip_local;
  
  chip->PSGStereo = 0xff;
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    chip->Registers[local_14 << 1] = 1;
    chip->Registers[local_14 * 2 + 1] = 0xf;
    chip->NoiseFreq = 0x10;
    chip->ToneFreqVals[local_14] = 0;
    chip->ToneFreqPos[local_14] = 1;
    chip->IntermediatePos[local_14] = 1.1754944e-38;
  }
  chip->LatchedRegister = '\0';
  chip->NoiseShiftRegister = 0x8000;
  chip->Clock = 0.0;
  return;
}

Assistant:

static void SN76489_Reset(SN76489_Context* chip)
{
	int i;

	chip->PSGStereo = 0xFF;

	for( i = 0; i <= 3; i++ )
	{
		/* Initialise PSG state */
		chip->Registers[2*i] = 1;		 /* tone freq=1 */
		chip->Registers[2*i+1] = 0xf;	 /* vol=off */
		chip->NoiseFreq = 0x10;

		/* Set counters to 0 */
		chip->ToneFreqVals[i] = 0;

		/* Set flip-flops to 1 */
		chip->ToneFreqPos[i] = 1;

		/* Set intermediate positions to do-not-use value */
		chip->IntermediatePos[i] = FLT_MIN;

		/* Set panning to centre */
		//Panning_Centre( chip->panning[i] );
	}

	chip->LatchedRegister = 0;

	/* Initialise noise generator */
	chip->NoiseShiftRegister = NoiseInitialState;

	/* Zero clock */
	chip->Clock = 0;
}